

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

int Abc_NtkMiterSatCreateInt(sat_solver *pSat,Abc_Ntk_t *pNtk)

{
  size_t sVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  uint *__ptr;
  undefined8 *puVar5;
  Vec_Ptr_t *vNodes;
  void **ppvVar6;
  Vec_Int_t *vVars;
  int *piVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  void *pvVar10;
  Abc_Obj_t *pAVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  Abc_Obj_t *local_48;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0x1de,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
  }
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pVVar9->pArray[lVar4] + 0x40) = 0;
      lVar4 = lVar4 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar4 < pVVar9->nSize);
  }
  __ptr = (uint *)malloc(0x10);
  *__ptr = 1000;
  puVar5 = (undefined8 *)malloc(8000);
  *(undefined8 **)(__ptr + 2) = puVar5;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  ppvVar6 = (void **)malloc(800);
  vNodes->pArray = ppvVar6;
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 100;
  vVars->nSize = 0;
  piVar7 = (int *)malloc(400);
  vVars->pArray = piVar7;
  pAVar8 = Abc_AigConst1(pNtk);
  pAVar8->field_0x14 = pAVar8->field_0x14 | 0x10;
  (pAVar8->field_6).pTemp = (void *)0x0;
  __ptr[1] = 1;
  *puVar5 = pAVar8;
  Abc_NtkClauseTriv(pSat,pAVar8,vVars);
  vNodes->nSize = 0;
  pVVar9 = pNtk->vCos;
  if (pVVar9->nSize < 1) {
    iVar13 = Abc_NtkClauseTop(pSat,vNodes,vVars);
    if (iVar13 == 0) goto LAB_00309053;
    uVar18 = 1;
    uVar17 = 1000;
LAB_00308c46:
    lVar4 = 0;
    uVar20 = uVar17;
    do {
      pAVar8 = *(Abc_Obj_t **)(*(long *)(__ptr + 2) + lVar4 * 8);
      if (((ulong)pAVar8 & 1) != 0) {
        __assert_fail("!Abc_ObjIsComplement(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                      ,0x20f,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
      }
      if (pAVar8->pNtk->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if ((pAVar8->vFanins).nSize == 2) {
        iVar13 = Abc_NodeIsMuxType(pAVar8);
        if (iVar13 == 0) {
          Abc_NtkCollectSupergate(pAVar8,1,vNodes);
          iVar13 = vNodes->nSize;
          if (0 < iVar13) {
            lVar14 = 0;
            do {
              uVar19 = (ulong)vNodes->pArray[lVar14] & 0xfffffffffffffffe;
              if ((*(uint *)(uVar19 + 0x14) & 0x10) == 0) {
                *(uint *)(uVar19 + 0x14) = *(uint *)(uVar19 + 0x14) | 0x10;
                lVar15 = (long)(int)uVar18;
                *(long *)(uVar19 + 0x40) = lVar15;
                uVar16 = (uint)uVar17;
                if (uVar18 == uVar16) {
                  if ((int)uVar16 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar10 = malloc(0x80);
                    }
                    else {
                      pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    *(void **)(__ptr + 2) = pvVar10;
                    *__ptr = 0x10;
                    uVar17 = 0x10;
                  }
                  else {
                    uVar17 = (ulong)(uVar16 * 2);
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar10 = malloc(uVar17 * 8);
                    }
                    else {
                      pvVar10 = realloc(*(void **)(__ptr + 2),uVar17 * 8);
                    }
                    *(void **)(__ptr + 2) = pvVar10;
                    *__ptr = uVar16 * 2;
                  }
                }
                else {
                  pvVar10 = *(void **)(__ptr + 2);
                }
                uVar18 = uVar18 + 1;
                *(ulong *)((long)pvVar10 + lVar15 * 8) = uVar19;
                iVar13 = vNodes->nSize;
                uVar20 = uVar17;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < iVar13);
          }
          if (iVar13 == 0) {
            iVar13 = Abc_NtkClauseTriv(pSat,(Abc_Obj_t *)((ulong)pAVar8 | 1),vVars);
          }
          else {
            iVar13 = Abc_NtkClauseAnd(pSat,pAVar8,vNodes,vVars);
          }
        }
        else {
          nMuxes = nMuxes + 1;
          pAVar11 = Abc_NodeRecognizeMux(pAVar8,&local_40,&local_48);
          vNodes->nSize = 0;
          uVar16 = vNodes->nCap;
          iVar13 = 0;
          ppvVar6 = vNodes->pArray;
          if (uVar16 == 0) {
            if (ppvVar6 == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
              iVar13 = 0;
            }
            else {
              ppvVar6 = (void **)realloc(ppvVar6,0x80);
              iVar13 = vNodes->nSize;
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
            uVar16 = 0x10;
          }
          pAVar3 = local_40;
          vNodes->nSize = iVar13 + 1U;
          ppvVar6[iVar13] = pAVar11;
          local_38 = pAVar11;
          if (iVar13 + 1U == uVar16) {
            if (iVar13 < 0xf) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar6;
              vNodes->nCap = 0x10;
              uVar16 = 0x10;
            }
            else {
              uVar16 = uVar16 * 2;
              if (vNodes->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar16 * 8);
              }
              else {
                ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar16 * 8);
              }
              vNodes->pArray = ppvVar6;
              vNodes->nCap = uVar16;
            }
          }
          else {
            ppvVar6 = vNodes->pArray;
          }
          pAVar11 = local_48;
          iVar13 = vNodes->nSize;
          vNodes->nSize = iVar13 + 1U;
          ppvVar6[iVar13] = pAVar3;
          if (iVar13 + 1U == uVar16) {
            if (iVar13 < 0xf) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar6;
              vNodes->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)(uVar16 * 2) * 8;
              if (vNodes->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(sVar1);
              }
              else {
                ppvVar6 = (void **)realloc(vNodes->pArray,sVar1);
              }
              vNodes->pArray = ppvVar6;
              vNodes->nCap = uVar16 * 2;
            }
          }
          else {
            ppvVar6 = vNodes->pArray;
          }
          iVar13 = vNodes->nSize;
          iVar12 = iVar13 + 1;
          vNodes->nSize = iVar12;
          ppvVar6[iVar13] = pAVar11;
          if (-1 < (long)iVar13) {
            lVar14 = 0;
            do {
              uVar19 = (ulong)vNodes->pArray[lVar14] & 0xfffffffffffffffe;
              if ((*(uint *)(uVar19 + 0x14) & 0x10) == 0) {
                *(uint *)(uVar19 + 0x14) = *(uint *)(uVar19 + 0x14) | 0x10;
                lVar15 = (long)(int)uVar18;
                *(long *)(uVar19 + 0x40) = lVar15;
                uVar16 = (uint)uVar20;
                if (uVar18 == uVar16) {
                  if ((int)uVar16 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar10 = malloc(0x80);
                    }
                    else {
                      pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    *(void **)(__ptr + 2) = pvVar10;
                    *__ptr = 0x10;
                    uVar17 = 0x10;
                    uVar20 = 0x10;
                  }
                  else {
                    uVar16 = uVar16 * 2;
                    uVar20 = (ulong)uVar16;
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar10 = malloc(uVar20 * 8);
                    }
                    else {
                      pvVar10 = realloc(*(void **)(__ptr + 2),uVar20 * 8);
                    }
                    *(void **)(__ptr + 2) = pvVar10;
                    *__ptr = uVar16;
                    uVar17 = (ulong)uVar16;
                  }
                }
                else {
                  pvVar10 = *(void **)(__ptr + 2);
                }
                uVar18 = uVar18 + 1;
                *(ulong *)((long)pvVar10 + lVar15 * 8) = uVar19;
                iVar12 = vNodes->nSize;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < iVar12);
          }
          iVar13 = Abc_NtkClauseMux(pSat,pAVar8,local_38,local_40,local_48,vVars);
        }
        if (iVar13 == 0) goto LAB_00309053;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)uVar18);
  }
  else {
    uVar18 = 1;
    uVar17 = 1000;
    iVar13 = 0;
    lVar4 = 0;
    do {
      plVar2 = (long *)pVVar9->pArray[lVar4];
      uVar20 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if ((*(uint *)(uVar20 + 0x14) & 0x10) == 0) {
        *(uint *)(uVar20 + 0x14) = *(uint *)(uVar20 + 0x14) | 0x10;
        lVar14 = (long)(int)uVar18;
        *(long *)(uVar20 + 0x40) = lVar14;
        uVar16 = (uint)uVar17;
        if (uVar18 == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar17 = (ulong)(uVar16 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(uVar17 * 8);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),uVar17 * 8);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = uVar16 * 2;
          }
        }
        else {
          pvVar10 = *(void **)(__ptr + 2);
        }
        uVar18 = uVar18 + 1;
        __ptr[1] = uVar18;
        *(ulong *)((long)pvVar10 + lVar14 * 8) = uVar20;
        uVar20 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        iVar13 = vNodes->nSize;
      }
      uVar16 = *(uint *)((long)plVar2 + 0x14);
      if (iVar13 == vNodes->nCap) {
        if (iVar13 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = 0x10;
        }
        else {
          sVar1 = (ulong)(uint)(iVar13 * 2) * 8;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(sVar1);
          }
          else {
            ppvVar6 = (void **)realloc(vNodes->pArray,sVar1);
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = iVar13 * 2;
        }
      }
      else {
        ppvVar6 = vNodes->pArray;
      }
      iVar12 = vNodes->nSize;
      iVar13 = iVar12 + 1;
      vNodes->nSize = iVar13;
      ppvVar6[iVar12] = (void *)(uVar16 >> 10 & 1 ^ uVar20);
      lVar4 = lVar4 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar4 < pVVar9->nSize);
    iVar13 = Abc_NtkClauseTop(pSat,vNodes,vVars);
    if (iVar13 == 0) {
LAB_00309053:
      iVar13 = 0;
      goto LAB_00309055;
    }
    if (0 < (int)uVar18) goto LAB_00308c46;
  }
  iVar13 = 1;
LAB_00309055:
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
  }
  free(vVars);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  return iVar13;
}

Assistant:

int Abc_NtkMiterSatCreateInt( sat_solver * pSat, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin, * pNodeC, * pNodeT, * pNodeE;
    Vec_Ptr_t * vNodes, * vSuper;
    Vec_Int_t * vVars;
    int i, k, fUseMuxes = 1;
//    int fOrderCiVarsFirst = 0;
    int RetValue = 0;

    assert( Abc_NtkIsStrash(pNtk) );

    // clean the CI node pointers
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;

    // start the data structures
    vNodes  = Vec_PtrAlloc( 1000 );   // the nodes corresponding to vars in the sat_solver
    vSuper  = Vec_PtrAlloc( 100 );    // the nodes belonging to the given implication supergate
    vVars   = Vec_IntAlloc( 100 );    // the temporary array for variables in the clause

    // add the clause for the constant node
    pNode = Abc_AigConst1(pNtk);
    pNode->fMarkA = 1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
    Vec_PtrPush( vNodes, pNode );
    Abc_NtkClauseTriv( pSat, pNode, vVars );
/*
    // add the PI variables first
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->fMarkA = 1;
        pNode->pCopy = (Abc_Obj_t *)vNodes->nSize;
        Vec_PtrPush( vNodes, pNode );
    }
*/
    // collect the nodes that need clauses and top-level assignments
    Vec_PtrClear( vSuper );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // get the fanin
        pFanin = Abc_ObjFanin0(pNode);
        // create the node's variable
        if ( pFanin->fMarkA == 0 )
        {
            pFanin->fMarkA = 1;
            pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
            Vec_PtrPush( vNodes, pFanin );
        }
        // add the trivial clause
        Vec_PtrPush( vSuper, Abc_ObjChild0(pNode) );
    }
    if ( !Abc_NtkClauseTop( pSat, vSuper, vVars ) )
        goto Quits;


    // add the clauses
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( !Abc_ObjIsComplement(pNode) );
        if ( !Abc_AigNodeIsAnd(pNode) )
            continue;
//printf( "%d ", pNode->Id );

        // add the clauses
        if ( fUseMuxes && Abc_NodeIsMuxType(pNode) )
        {
            nMuxes++;

            pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
            Vec_PtrClear( vSuper );
            Vec_PtrPush( vSuper, pNodeC );
            Vec_PtrPush( vSuper, pNodeT );
            Vec_PtrPush( vSuper, pNodeE );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( !Abc_NtkClauseMux( pSat, pNode, pNodeC, pNodeT, pNodeE, vVars ) )
                goto Quits;
        }
        else
        {
            // get the supergate
            Abc_NtkCollectSupergate( pNode, fUseMuxes, vSuper );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( vSuper->nSize == 0 )
            {
                if ( !Abc_NtkClauseTriv( pSat, Abc_ObjNot(pNode), vVars ) )
//                if ( !Abc_NtkClauseTriv( pSat, pNode, vVars ) )
                    goto Quits;
            }
            else
            {
                if ( !Abc_NtkClauseAnd( pSat, pNode, vSuper, vVars ) )
                    goto Quits;
            }
        }
    }
/*
    // set preferred variables
    if ( fOrderCiVarsFirst )
    {
        int * pPrefVars = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        int nVars = 0;
        Abc_NtkForEachCi( pNtk, pNode, i )
        {
            if ( pNode->fMarkA == 0 )
                continue;
            pPrefVars[nVars++] = (int)pNode->pCopy;
        }
        nVars = Abc_MinInt( nVars, 10 );
        ASat_SolverSetPrefVars( pSat, pPrefVars, nVars );
    }
*/
/*
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        if ( !pNode->fMarkA )
            continue;
        printf( "%10s : ", Abc_ObjName(pNode) );
        printf( "%3d\n", (int)pNode->pCopy );
    }
    printf( "\n" );
*/
    RetValue = 1;
Quits :
    // delete
    Vec_IntFree( vVars );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vSuper );
    return RetValue;
}